

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O0

void __thiscall
asmjit::v1_14::ZoneTree<asmjit::v1_14::AddressTableEntry>::
insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
          (ZoneTree<asmjit::v1_14::AddressTableEntry> *this,AddressTableEntry *node,
          Compare<(asmjit::v1_14::Support::SortOrder)0> *cmp)

{
  bool bVar1;
  ZoneTreeNode *root;
  ulong uVar2;
  ZoneTreeNode *in_RSI;
  long *in_RDI;
  size_t last;
  size_t dir;
  ZoneTreeNode *q;
  ZoneTreeNode *t;
  ZoneTreeNode *p;
  ZoneTreeNode *g;
  ZoneTreeNode head;
  char *in_stack_00000260;
  int in_stack_0000026c;
  char *in_stack_00000270;
  ZoneTreeNode *local_198;
  ZoneTreeNode *dir_00;
  ulong local_168;
  ulong local_160;
  ZoneTreeNode *local_158;
  ZoneTreeNode *local_150;
  ZoneTreeNode *local_148;
  ZoneTreeNode *local_140;
  ZoneTreeNode local_138 [8];
  long local_130;
  ZoneTreeNode local_128 [8];
  ZoneTreeNode *local_120;
  ulong local_110;
  ZoneTreeNode *local_108;
  ulong local_100;
  ZoneTreeNode *local_f8;
  ZoneTreeNode *local_d8;
  long local_d0;
  ZoneTreeNode *local_c8;
  ZoneTreeNode *local_c0;
  ZoneTreeNode *local_b8;
  ZoneTreeNode *local_b0;
  ulong local_a8;
  ZoneTreeNode *local_a0;
  ZoneTreeNode *local_98;
  ulong local_90;
  ZoneTreeNode *local_88;
  ZoneTreeNode *local_80;
  ZoneTreeNode *local_78;
  ZoneTreeNode *local_68;
  ZoneTreeNode *local_60;
  ZoneTreeNode *local_58;
  ulong *local_48;
  ulong *local_40;
  ZoneTreeNode *local_30;
  ZoneTreeNode *local_18;
  ZoneTreeNode *local_8;
  
  if (1 < *(ulong *)in_RSI) {
    DebugUtils::assertionFailed(in_stack_00000270,in_stack_0000026c,in_stack_00000260);
  }
  if (*(ulong *)(in_RSI + 8) == 0) {
    if ((*(ulong *)in_RSI & 1) == 0) {
      if (*in_RDI == 0) {
        *in_RDI = (long)in_RSI;
      }
      else {
        root = local_138;
        dir_00 = local_128;
        local_120 = in_RSI;
        local_d8 = root;
        do {
          *(undefined8 *)root = 0;
          root = root + 8;
        } while (root != dir_00);
        local_d0 = *in_RDI;
        local_c8 = local_138;
        local_140 = (ZoneTreeNode *)0x0;
        local_148 = (ZoneTreeNode *)0x0;
        local_150 = local_138;
        local_158 = (ZoneTreeNode *)*in_RDI;
        local_160 = 0;
        local_168 = 0;
        local_b8 = local_120;
        *(ulong *)local_120 = *(ulong *)local_120 | 1;
        local_130 = local_d0;
        while( true ) {
          if (local_158 == (ZoneTreeNode *)0x0) {
            local_158 = local_120;
            local_88 = local_148;
            local_90 = local_160;
            local_98 = local_120;
            *(ulong *)(local_148 + local_160 * 8) =
                 *(ulong *)(local_148 + local_160 * 8) & 1 | (ulong)local_120;
          }
          else {
            local_78 = local_158;
            bVar1 = _isValidRed((ZoneTreeNode *)(*(ulong *)local_158 & 0xfffffffffffffffe));
            if (bVar1) {
              local_58 = local_158;
              bVar1 = _isValidRed(*(ZoneTreeNode **)(local_158 + 8));
              if (bVar1) {
                local_c0 = local_158;
                *(ulong *)local_158 = *(ulong *)local_158 | 1;
                local_80 = local_158;
                local_40 = (ulong *)(*(ulong *)local_158 & 0xfffffffffffffffe);
                *local_40 = *local_40 & 0xfffffffffffffffe;
                local_60 = local_158;
                local_48 = *(ulong **)(local_158 + 8);
                *local_48 = *local_48 & 0xfffffffffffffffe;
              }
            }
          }
          bVar1 = _isValidRed(local_158);
          if ((bVar1) && (bVar1 = _isValidRed(local_148), bVar1)) {
            local_68 = local_150;
            uVar2 = (ulong)(*(ZoneTreeNode **)(local_150 + 8) == local_140);
            local_f8 = local_148;
            local_100 = local_168;
            if (local_158 ==
                (ZoneTreeNode *)(*(ulong *)(local_148 + local_168 * 8) & 0xfffffffffffffffe)) {
              local_198 = _singleRotate(local_140,(ulong)((local_168 != 0 ^ 0xffU) & 1));
            }
            else {
              local_198 = _doubleRotate(root,(size_t)dir_00);
            }
            local_a0 = local_150;
            local_b0 = local_198;
            *(ulong *)(local_150 + uVar2 * 8) =
                 *(ulong *)(local_150 + uVar2 * 8) & 1 | (ulong)local_198;
            local_a8 = uVar2;
          }
          if (local_158 == local_120) break;
          local_168 = local_160;
          local_30 = local_158;
          local_18 = local_158;
          local_8 = local_158;
          local_160 = (ulong)((int)((uint)(*(ulong *)(local_120 + 0x10) <
                                          *(ulong *)(local_158 + 0x10)) -
                                   (uint)(*(ulong *)(local_158 + 0x10) <
                                         *(ulong *)(local_120 + 0x10))) < 0);
          if (local_140 != (ZoneTreeNode *)0x0) {
            local_150 = local_140;
          }
          local_140 = local_148;
          local_148 = local_158;
          local_108 = local_158;
          local_158 = (ZoneTreeNode *)(*(ulong *)(local_158 + local_160 * 8) & 0xfffffffffffffffe);
          local_110 = local_160;
        }
        *in_RDI = local_130;
        *(ulong *)*in_RDI = *(ulong *)*in_RDI & 0xfffffffffffffffe;
      }
      return;
    }
    DebugUtils::assertionFailed(in_stack_00000270,in_stack_0000026c,in_stack_00000260);
  }
  DebugUtils::assertionFailed(in_stack_00000270,in_stack_0000026c,in_stack_00000260);
}

Assistant:

void insert(NodeT* ASMJIT_NONNULL(node), const CompareT& cmp = CompareT()) noexcept {
    // Node to insert must not contain garbage.
    ASMJIT_ASSERT(!node->hasLeft());
    ASMJIT_ASSERT(!node->hasRight());
    ASMJIT_ASSERT(!node->isRed());

    if (!_root) {
      _root = node;
      return;
    }

    ZoneTreeNode head;           // False root node,
    head._setRight(_root);       // having root on the right.

    ZoneTreeNode* g = nullptr;   // Grandparent.
    ZoneTreeNode* p = nullptr;   // Parent.
    ZoneTreeNode* t = &head;     // Iterator.
    ZoneTreeNode* q = _root;     // Query.

    size_t dir = 0;              // Direction for accessing child nodes.
    size_t last = 0;             // Not needed to initialize, but makes some tools happy.

    node->_makeRed();            // New nodes are always red and violations fixed appropriately.

    // Search down the tree.
    for (;;) {
      if (!q) {
        // Insert new node at the bottom.
        q = node;
        p->_setChild(dir, node);
      }
      else if (_isValidRed(q->_getLeft()) && _isValidRed(q->_getRight())) {
        // Color flip.
        q->_makeRed();
        q->_getLeft()->_makeBlack();
        q->_getRight()->_makeBlack();
      }

      // Fix red violation.
      if (_isValidRed(q) && _isValidRed(p)) {
        ASMJIT_ASSUME(g != nullptr);
        ASMJIT_ASSUME(p != nullptr);
        t->_setChild(t->_getRight() == g,
                     q == p->_getChild(last) ? _singleRotate(g, !last) : _doubleRotate(g, !last));
      }

      // Stop if found.
      if (q == node)
        break;

      last = dir;
      dir = cmp(*static_cast<NodeT*>(q), *static_cast<NodeT*>(node)) < 0;

      // Update helpers.
      if (g) t = g;

      g = p;
      p = q;
      q = q->_getChild(dir);
    }

    // Update root and make it black.
    _root = static_cast<NodeT*>(head._getRight());
    _root->_makeBlack();
  }